

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestCaseUtil.hpp
# Opt level: O2

void __thiscall
vkt::
InstanceFactory1<vkt::wsi::(anonymous_namespace)::DisplayTimingTestInstance,_vkt::wsi::(anonymous_namespace)::TestConfig,_vkt::wsi::(anonymous_namespace)::Programs>
::initPrograms(InstanceFactory1<vkt::wsi::(anonymous_namespace)::DisplayTimingTestInstance,_vkt::wsi::(anonymous_namespace)::TestConfig,_vkt::wsi::(anonymous_namespace)::Programs>
               *this,SourceCollections *dst)

{
  ProgramSources *pPVar1;
  allocator<char> local_7a;
  allocator<char> local_79;
  string local_78;
  string local_58;
  undefined1 local_38 [40];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"quad-vert",&local_79);
  pPVar1 = ::vk::ProgramCollection<glu::ProgramSources>::add(&dst->glslSources,&local_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "#version 450\nout gl_PerVertex {\n\tvec4 gl_Position;\n};\nhighp float;\nvoid main (void) {\n\tgl_Position = vec4(((gl_VertexIndex + 2) / 3) % 2 == 0 ? -1.0 : 1.0,\n\t                   ((gl_VertexIndex + 1) / 3) % 2 == 0 ? -1.0 : 1.0, 0.0, 1.0);\n}\n"
             ,&local_7a);
  glu::VertexSource::VertexSource((VertexSource *)local_38,&local_78);
  glu::ProgramSources::operator<<(pPVar1,(ShaderSource *)local_38);
  std::__cxx11::string::~string((string *)(local_38 + 8));
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"quad-frag",&local_79);
  pPVar1 = ::vk::ProgramCollection<glu::ProgramSources>::add(&dst->glslSources,&local_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "#version 310 es\nlayout(location = 0) out highp vec4 o_color;\nlayout(push_constant) uniform PushConstant {\n\thighp uint frameNdx;\n} pushConstants;\nvoid main (void)\n{\n\thighp uint frameNdx = pushConstants.frameNdx;\n\thighp uint x = frameNdx + uint(gl_FragCoord.x);\n\thighp uint y = frameNdx + uint(gl_FragCoord.y);\n\thighp uint r = 128u * bitfieldExtract(x, 0, 1)\n\t             +  64u * bitfieldExtract(y, 1, 1)\n\t             +  32u * bitfieldExtract(x, 3, 1);\n\thighp uint g = 128u * bitfieldExtract(y, 0, 1)\n\t             +  64u * bitfieldExtract(x, 2, 1)\n\t             +  32u * bitfieldExtract(y, 3, 1);\n\thighp uint b = 128u * bitfieldExtract(x, 1, 1)\n\t             +  64u * bitfieldExtract(y, 2, 1)\n\t             +  32u * bitfieldExtract(x, 4, 1);\n\to_color = vec4(float(r) / 255.0, float(g) / 255.0, float(b) / 255.0, 1.0);\n}\n"
             ,&local_7a);
  glu::FragmentSource::FragmentSource((FragmentSource *)local_38,&local_78);
  glu::ProgramSources::operator<<(pPVar1,(ShaderSource *)local_38);
  std::__cxx11::string::~string((string *)(local_38 + 8));
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

void			initPrograms		(vk::SourceCollections& dst) const { m_progs.init(dst, m_arg0); }